

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcFaceSurface::IfcFaceSurface(IfcFaceSurface *this)

{
  IfcFaceSurface *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x80,"IfcFaceSurface");
  IfcFace::IfcFace(&this->super_IfcFace,&PTR_construction_vtable_24__00fa89f8);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFaceSurface,_2UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcFaceSurface,_2UL> *)
             &(this->super_IfcFace).field_0x48,&PTR_construction_vtable_24__00fa8a70);
  (this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0xfa8940;
  *(undefined8 *)&this->field_0x80 = 0xfa89e0;
  *(undefined8 *)
   &(this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0xfa8968;
  *(undefined8 *)
   &(this->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 = 0xfa8990;
  *(undefined8 *)&(this->super_IfcFace).field_0x48 = 0xfa89b8;
  STEP::Lazy<Assimp::IFC::Schema_2x3::IfcSurface>::Lazy
            ((Lazy<Assimp::IFC::Schema_2x3::IfcSurface> *)&(this->super_IfcFace).field_0x58,
             (LazyObject *)0x0);
  std::__cxx11::string::string((string *)&this->SameSense);
  return;
}

Assistant:

IfcFaceSurface() : Object("IfcFaceSurface") {}